

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O2

void ssh_add_special(void *vctx,char *text,SessionSpecialCode code,int arg)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = safegrowarray(*vctx,(size_t *)((long)vctx + 0x10),0x10,*(size_t *)((long)vctx + 8),1,
                         false);
  *(void **)vctx = pvVar1;
  lVar2 = *(long *)((long)vctx + 8);
  *(long *)((long)vctx + 8) = lVar2 + 1;
  lVar2 = lVar2 * 0x10;
  *(char **)((long)pvVar1 + lVar2) = text;
  *(SessionSpecialCode *)((long)pvVar1 + lVar2 + 8) = code;
  *(int *)((long)pvVar1 + lVar2 + 0xc) = arg;
  return;
}

Assistant:

static void ssh_add_special(void *vctx, const char *text,
                            SessionSpecialCode code, int arg)
{
    struct ssh_add_special_ctx *ctx = (struct ssh_add_special_ctx *)vctx;
    SessionSpecial *spec;

    sgrowarray(ctx->specials, ctx->specials_size, ctx->nspecials);
    spec = &ctx->specials[ctx->nspecials++];
    spec->name = text;
    spec->code = code;
    spec->arg = arg;
}